

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix22<double> * __thiscall
Imath_3_2::Matrix22<double>::setRotation<double>(Matrix22<double> *this,double r)

{
  Matrix22<double> *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double sin_r;
  double cos_r;
  
  dVar1 = cos(in_XMM0_Qa);
  dVar2 = sin(in_XMM0_Qa);
  in_RDI->x[0][0] = dVar1;
  in_RDI->x[0][1] = dVar2;
  in_RDI->x[1][0] = -dVar2;
  in_RDI->x[1][1] = dVar1;
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE inline const Matrix22<T>&
Matrix22<T>::setRotation (S r) IMATH_NOEXCEPT
{
    S cos_r, sin_r;

    cos_r = cos ((T) r);
    sin_r = sin ((T) r);

    x[0][0] = cos_r;
    x[0][1] = sin_r;

    x[1][0] = -sin_r;
    x[1][1] = cos_r;

    return *this;
}